

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O2

int __thiscall MovDemuxer::mov_read_wide(MovDemuxer *this,MOVAtom atom)

{
  MOVAtom atom_00;
  uint uVar1;
  uint64_t size;
  
  if (7 < atom.size) {
    uVar1 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
    if (uVar1 == 0) {
      uVar1 = IOContextDemuxer::get_le32(&this->super_IOContextDemuxer);
      size = atom.size - 8;
      if (uVar1 == 0x7461646d) {
        atom_00._4_4_ = atom._4_4_;
        atom_00.type = 0x7461646d;
        atom_00.offset = atom.offset + 8;
        atom_00.size = size;
        mov_read_mdat(this,atom_00);
        return 0;
      }
    }
    else {
      size = atom.size - 4;
    }
    IOContextDemuxer::skip_bytes(&this->super_IOContextDemuxer,size);
  }
  return 0;
}

Assistant:

int MovDemuxer::mov_read_wide(MOVAtom atom)
{
    if (atom.size < 8)
        return 0;  // continue
    if (get_be32() != 0)
    {  // 0 sized mdat atom... use the 'wide' atom size
        skip_bytes(atom.size - 4);
        return 0;
    }
    atom.type = get_le32();
    atom.offset += 8;
    atom.size -= 8;
    if (atom.type != MKTAG('m', 'd', 'a', 't'))
    {
        skip_bytes(atom.size);
        return 0;
    }
    const int err = mov_read_mdat(atom);
    return err;
}